

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.cpp
# Opt level: O2

string * __thiscall
FunctionPointerType::defToString_abi_cxx11_
          (string *__return_storage_ptr__,FunctionPointerType *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if ((this->typeEnd)._M_string_length == 0) {
    std::operator+(&local_38,"typedef ",&this->type);
    std::operator+(&bStack_78,&local_38," ");
    std::operator+(&local_58,&bStack_78,&this->name);
    std::operator+(__return_storage_ptr__,&local_58,";");
  }
  else {
    std::operator+(&local_38,"typedef ",&this->type);
    std::operator+(&bStack_78,&local_38,&this->name);
    std::operator+(&local_58,&bStack_78,&this->typeEnd);
    std::operator+(__return_storage_ptr__,&local_58,";");
  }
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&bStack_78);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string FunctionPointerType::defToString() const {
    if (typeEnd.empty()) {
        return "typedef " + type + " " + name + ";";
    }

    return "typedef " + type + name + typeEnd + ";";
}